

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O2

void show_topten(char *player,wchar_t top,wchar_t around,nh_bool own)

{
  uint *__s;
  nh_menuitem_conflict *pnVar1;
  char cVar2;
  uint uVar3;
  nh_menuitem_role nVar4;
  wchar_t wVar5;
  int iVar6;
  long lVar7;
  nh_menuitem_conflict *items;
  ulong uVar8;
  size_t sVar9;
  char *pcVar10;
  undefined7 in_register_00000009;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  char *pcVar17;
  nh_menuitem *_item_;
  ulong uVar18;
  long lVar19;
  uint *puVar20;
  wchar_t listlen;
  ulong local_3a8;
  ulong local_3a0;
  nh_menuitem_conflict *local_398;
  long local_390;
  char hpbuf [16];
  char local_368 [16];
  char fmt [32];
  char buf [256];
  char line [256];
  char txt [256];
  
  listlen = L'\0';
  lVar7 = nh_get_topten(&listlen,buf,player,top,around,
                        CONCAT71(in_register_00000009,own) & 0xffffffff);
  if (listlen == L'\0') {
    curses_msgwin("There are no scores to show.");
  }
  else {
    wclear(_stdscr);
    wrefresh(_stdscr);
    wVar5 = listlen;
    uVar18 = (long)listlen * 2 + 4;
    items = (nh_menuitem_conflict *)malloc(uVar18 * 0x10c);
    if (buf[0] == '\0') {
      uVar13 = 0;
    }
    else {
      if (wVar5 < L'\xffffffff') {
        uVar13 = (int)uVar18 * 2;
        uVar18 = (ulong)uVar13;
        items = (nh_menuitem_conflict *)realloc(items,(long)(int)uVar13 * 0x10c);
      }
      items->id = L'\0';
      items->role = MI_TEXT;
      items->accel = '\0';
      items->group_accel = '\0';
      items->selected = '\0';
      strcpy(items->caption,buf);
      if ((int)uVar18 < 2) {
        uVar13 = (int)uVar18 * 2;
        uVar18 = (ulong)uVar13;
        items = (nh_menuitem_conflict *)realloc(items,(long)(int)uVar13 * 0x10c);
      }
      items[1].accel = '\0';
      items[1].group_accel = '\0';
      items[1].selected = '\0';
      items[1].caption[0] = '\0';
      items[1].id = L'\0';
      items[1].role = MI_TEXT;
      uVar13 = 2;
    }
    builtin_strncpy(buf," No     Points   Name",0x16);
    uVar8 = strlen(buf);
    for (; uVar8 < (long)_COLS - 0xeU; uVar8 = uVar8 + 1) {
      buf[uVar8] = ' ';
    }
    builtin_strncpy(buf + uVar8," Hp [max] ",0xb);
    if ((int)uVar18 <= (int)uVar13) {
      uVar3 = (int)uVar18 * 2;
      uVar18 = (ulong)uVar3;
      items = (nh_menuitem_conflict *)realloc(items,(long)(int)uVar3 * 0x10c);
    }
    pnVar1 = items + uVar13;
    pnVar1->id = L'\0';
    pnVar1->role = MI_HEADING;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,buf);
    uVar13 = uVar13 | 1;
    lVar12 = 0;
    while( true ) {
      iVar14 = _COLS;
      lVar15 = (long)(int)uVar13;
      if (listlen <= lVar12) break;
      lVar19 = lVar12 * 0x298;
      cVar2 = *(char *)(lVar7 + 0x294 + lVar19);
      lVar16 = (long)_COLS;
      local_3a8 = uVar18;
      local_3a0 = (ulong)uVar13;
      local_398 = items;
      local_390 = lVar15;
      if (*(int *)(lVar7 + 0xc + lVar19) < 1) {
        hpbuf[0] = '-';
        hpbuf[1] = '\0';
      }
      else {
        sprintf(hpbuf,"%d");
      }
      puVar20 = (uint *)(lVar19 + lVar7);
      nVar4 = (uint)(cVar2 != '\0') * 2;
      sprintf(local_368,"[%d]",(ulong)puVar20[4]);
      uVar18 = lVar16 - 0x20;
      __s = puVar20 + 0x65;
      sVar9 = strlen((char *)__s);
      if (uVar18 < sVar9) {
        strncpy(txt,(char *)__s,0x100);
        pcVar17 = line + lVar16 + 0xe1;
        uVar8 = uVar18;
        do {
          uVar11 = uVar8;
          pcVar10 = pcVar17;
          pcVar17 = pcVar10 + -1;
          if ((long)uVar11 < 1) break;
          uVar8 = uVar11 - 1;
        } while (pcVar10[-1] != ' ');
        if (5 < (long)uVar11) {
          iVar6 = strncmp(pcVar10 + -6," [max",5);
          if (iVar6 == 0) {
            pcVar17 = pcVar10 + -6;
          }
        }
        uVar8 = local_3a0;
        *pcVar17 = '\0';
        sprintf(fmt,"%%4d %%10d  %%-%ds",(ulong)(iVar14 - 0x15));
        sprintf(line,fmt,(ulong)*puVar20,(ulong)puVar20[1],txt);
        items = local_398;
        if ((int)local_3a8 <= (int)uVar8) {
          uVar13 = (int)local_3a8 * 2;
          local_3a8 = (ulong)uVar13;
          items = (nh_menuitem_conflict *)realloc(local_398,(long)(int)uVar13 * 0x10c);
        }
        pnVar1 = items + local_390;
        pnVar1->id = L'\0';
        pnVar1->role = nVar4;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,line);
        iVar14 = (int)uVar8 + 1;
        sprintf(fmt,"%%%ds%%-%ds %%3s %%5s ",0x11,uVar18 & 0xffffffff);
        sprintf(line,fmt,"",pcVar17 + 1,hpbuf,local_368);
        uVar18 = local_3a8;
        if ((int)local_3a8 <= iVar14) {
LAB_00116fa4:
          uVar13 = (int)local_3a8 * 2;
          items = (nh_menuitem_conflict *)realloc(items,(long)(int)uVar13 * 0x10c);
          uVar18 = (ulong)uVar13;
        }
      }
      else {
        sprintf(fmt,"%%4d %%10d  %%-%ds %%3s %%5s ",uVar18 & 0xffffffff);
        sprintf(line,fmt,(ulong)*puVar20,(ulong)puVar20[1],__s,hpbuf,local_368);
        iVar14 = (int)local_3a0;
        items = local_398;
        uVar18 = local_3a8;
        if ((int)local_3a8 <= iVar14) goto LAB_00116fa4;
      }
      pnVar1 = items + iVar14;
      pnVar1->id = L'\0';
      pnVar1->role = nVar4;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,line);
      uVar13 = iVar14 + 1;
      lVar12 = lVar12 + 1;
    }
    if ((int)uVar18 <= (int)uVar13) {
      items = (nh_menuitem_conflict *)realloc(items,(long)((int)uVar18 * 2) * 0x10c);
    }
    items[lVar15].accel = '\0';
    items[lVar15].group_accel = '\0';
    items[lVar15].selected = '\0';
    items[lVar15].caption[0] = '\0';
    items[lVar15].id = L'\0';
    items[lVar15].role = MI_TEXT;
    curses_display_menu(items,uVar13 + L'\x01',"Top scores:",L'\0',(wchar_t *)0x0);
    free(items);
  }
  return;
}

Assistant:

void show_topten(char *player, int top, int around, nh_bool own)
{
    struct nh_topten_entry *scores;
    char buf[BUFSZ];
    int i, listlen = 0;
    struct nh_menuitem *items;
    int icount, size;
    
    scores = nh_get_topten(&listlen, buf, player, top, around, own);
    
    if (listlen == 0) {
	curses_msgwin("There are no scores to show.");
	return;
    }
    
    /* show the score list on a blank screen */
    clear();
    refresh();

    icount = 0;
    size = 4 + listlen * 2; /* maximum length, only required if every item wraps */
    items = malloc(size * sizeof(struct nh_menuitem));
    
    /* buf has the topten status if there is one, eg:
     *  "you did not beat your previous score" */
    if (buf[0]) { 
	add_menu_txt(items, size, icount, buf, MI_TEXT);
	add_menu_txt(items, size, icount, "", MI_TEXT);
    }
    
    makeheader(buf);
    add_menu_txt(items, size, icount, buf, MI_HEADING);
    
    for (i = 0; i < listlen; i++)
	topten_add_score(&scores[i], &items, &size, &icount, COLS - 4);
    add_menu_txt(items, size, icount, "", MI_TEXT);
    
    curses_display_menu(items, icount, "Top scores:", PICK_NONE, NULL);
    free(items);
}